

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegexpIsDeterminist(xmlRegexpPtr comp)

{
  xmlAutomataPtr ctxt;
  int local_28;
  int i;
  int ret;
  xmlAutomataPtr am;
  xmlRegexpPtr comp_local;
  
  if (comp == (xmlRegexpPtr)0x0) {
    comp_local._4_4_ = -1;
  }
  else if (comp->determinist == -1) {
    ctxt = xmlNewAutomata();
    if (ctxt == (xmlAutomataPtr)0x0) {
      comp_local._4_4_ = -1;
    }
    else {
      if (ctxt->states != (xmlRegStatePtr *)0x0) {
        for (local_28 = 0; local_28 < ctxt->nbStates; local_28 = local_28 + 1) {
          xmlRegFreeState(ctxt->states[local_28]);
        }
        (*xmlFree)(ctxt->states);
      }
      ctxt->nbAtoms = comp->nbAtoms;
      ctxt->atoms = comp->atoms;
      ctxt->nbStates = comp->nbStates;
      ctxt->states = comp->states;
      ctxt->determinist = -1;
      ctxt->flags = comp->flags;
      comp_local._4_4_ = xmlFAComputesDeterminism(ctxt);
      ctxt->atoms = (xmlRegAtomPtr *)0x0;
      ctxt->states = (xmlRegStatePtr *)0x0;
      xmlFreeAutomata(ctxt);
      comp->determinist = comp_local._4_4_;
    }
  }
  else {
    comp_local._4_4_ = comp->determinist;
  }
  return comp_local._4_4_;
}

Assistant:

int
xmlRegexpIsDeterminist(xmlRegexpPtr comp) {
    xmlAutomataPtr am;
    int ret;

    if (comp == NULL)
	return(-1);
    if (comp->determinist != -1)
	return(comp->determinist);

    am = xmlNewAutomata();
    if (am == NULL)
        return(-1);
    if (am->states != NULL) {
	int i;

	for (i = 0;i < am->nbStates;i++)
	    xmlRegFreeState(am->states[i]);
	xmlFree(am->states);
    }
    am->nbAtoms = comp->nbAtoms;
    am->atoms = comp->atoms;
    am->nbStates = comp->nbStates;
    am->states = comp->states;
    am->determinist = -1;
    am->flags = comp->flags;
    ret = xmlFAComputesDeterminism(am);
    am->atoms = NULL;
    am->states = NULL;
    xmlFreeAutomata(am);
    comp->determinist = ret;
    return(ret);
}